

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

bool __thiscall
cmsys::SystemInformationImplementation::QueryLinuxMemory(SystemInformationImplementation *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  int i;
  long lVar6;
  uint uVar7;
  bool bVar8;
  unsigned_long cachedMem;
  unsigned_long ap;
  unsigned_long av;
  unsigned_long tp;
  unsigned_long tv;
  unsigned_long buffersMem;
  unsigned_long temp;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  utsname unameInfo;
  char buffer [1024];
  
  uVar7 = 0;
  tv = 0;
  tp = 0;
  av = 0;
  ap = 0;
  iVar1 = uname((utsname *)&unameInfo);
  if (iVar1 == 0) {
    sVar5 = strlen(unameInfo.release);
    bVar8 = false;
    if (2 < sVar5) {
      uVar7 = 0;
      if ((int)unameInfo.release[0] - 0x30U < 10) {
        uVar7 = (int)unameInfo.release[0] - 0x30U;
      }
      bVar8 = '5' < unameInfo.release[2] && (int)unameInfo.release[2] - 0x30U < 10;
    }
    __stream = fopen64("/proc/meminfo","r");
    if (__stream != (FILE *)0x0) {
      if ((2 < (int)uVar7) || ((bool)(uVar7 == 2 & bVar8))) {
        cachedMem._4_2_ = 0;
        cachedMem._0_4_ = 0;
        pcVar4 = fgets(buffer,0x400,__stream);
        bVar8 = false;
        if (pcVar4 != (char *)0x0) {
          lVar6 = 0;
          iVar1 = 0;
          do {
            do {
              if ((*(char *)((long)&cachedMem + lVar6) == '\0') &&
                 (iVar2 = __isoc99_sscanf(buffer,(long)&DAT_004eef14 +
                                                 (long)(int)(&DAT_004eef14)[lVar6],&temp + lVar6),
                 iVar2 == 1)) {
                *(undefined1 *)((long)&cachedMem + lVar6) = 1;
                iVar1 = iVar1 + 1;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 != 6);
            pcVar4 = fgets(buffer,0x400,__stream);
            lVar6 = 0;
          } while (pcVar4 != (char *)0x0);
          bVar8 = iVar1 == 6;
        }
        if (!bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          fclose(__stream);
          return false;
        }
        this->TotalPhysicalMemory = temp >> 10;
        this->AvailablePhysicalMemory = (ulong)(local_5e8 + local_5f0 + local_5e0) >> 10;
        this->TotalVirtualMemory = local_5d8 >> 10;
        this->AvailableVirtualMemory = local_5d0 >> 10;
      }
      else {
        pcVar4 = fgets(buffer,0x400,__stream);
        iVar1 = 0;
        if (pcVar4 == buffer) {
          iVar1 = __isoc99_fscanf(__stream,"Mem: %lu %lu %lu %lu %lu %lu\n",&tp,&temp,&ap,&temp,
                                  &buffersMem,&cachedMem);
        }
        if (iVar1 == 6) {
          iVar1 = __isoc99_fscanf(__stream,"Swap: %lu %lu %lu\n",&tv,&temp,&av);
          iVar1 = iVar1 + 6;
        }
        if (iVar1 != 9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Problem parsing /proc/meminfo",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
          fclose(__stream);
          return false;
        }
        this->TotalVirtualMemory = tv >> 0x14;
        this->TotalPhysicalMemory = tp >> 0x14;
        this->AvailableVirtualMemory = av >> 0x14;
        this->AvailablePhysicalMemory =
             buffersMem + ap +
             CONCAT26(cachedMem._6_2_,CONCAT24(cachedMem._4_2_,(undefined4)cachedMem)) >> 0x14;
      }
      fclose(__stream);
      return true;
    }
    pcVar4 = "Problem opening /proc/meminfo";
    sVar5 = 0x1d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem calling uname(): ",0x19);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d7850);
      goto LAB_0040f3c8;
    }
    sVar5 = strlen(pcVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar5);
LAB_0040f3c8:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return false;
}

Assistant:

bool SystemInformationImplementation::QueryLinuxMemory()
{
#if defined(__linux)
  unsigned long tv=0;
  unsigned long tp=0;
  unsigned long av=0;
  unsigned long ap=0;

  char buffer[1024]; // for reading lines

  int linuxMajor = 0;
  int linuxMinor = 0;

  // Find the Linux kernel version first
  struct utsname unameInfo;
  int errorFlag = uname(&unameInfo);
  if( errorFlag!=0 )
    {
    std::cout << "Problem calling uname(): " << strerror(errno) << std::endl;
    return false;
    }

  if( strlen(unameInfo.release)>=3 )
    {
    // release looks like "2.6.3-15mdk-i686-up-4GB"
    char majorChar=unameInfo.release[0];
    char minorChar=unameInfo.release[2];

    if( isdigit(majorChar) )
      {
      linuxMajor=majorChar-'0';
      }

    if( isdigit(minorChar) )
      {
      linuxMinor=minorChar-'0';
      }
    }

  FILE *fd = fopen("/proc/meminfo", "r" );
  if ( !fd )
    {
    std::cout << "Problem opening /proc/meminfo" << std::endl;
    return false;
    }

  if( linuxMajor>=3 || ( (linuxMajor>=2) && (linuxMinor>=6) ) )
    {
    // new /proc/meminfo format since kernel 2.6.x
    // Rigorously, this test should check from the developping version 2.5.x
    // that introduced the new format...

    enum { mMemTotal, mMemFree, mBuffers, mCached, mSwapTotal, mSwapFree };
    const char* format[6] =
      { "MemTotal:%lu kB", "MemFree:%lu kB", "Buffers:%lu kB",
        "Cached:%lu kB", "SwapTotal:%lu kB", "SwapFree:%lu kB" };
    bool have[6] = { false, false, false, false, false, false };
    unsigned long value[6];
    int count = 0;
    while(fgets(buffer, static_cast<int>(sizeof(buffer)), fd))
      {
      for(int i=0; i < 6; ++i)
        {
        if(!have[i] && sscanf(buffer, format[i], &value[i]) == 1)
          {
          have[i] = true;
          ++count;
          }
        }
      }
    if(count == 6)
      {
      this->TotalPhysicalMemory = value[mMemTotal] / 1024;
      this->AvailablePhysicalMemory =
        (value[mMemFree] + value[mBuffers] + value[mCached]) / 1024;
      this->TotalVirtualMemory = value[mSwapTotal] / 1024;
      this->AvailableVirtualMemory = value[mSwapFree] / 1024;
      }
    else
      {
      std::cout << "Problem parsing /proc/meminfo" << std::endl;
      fclose(fd);
      return false;
      }
    }
  else
    {
    // /proc/meminfo format for kernel older than 2.6.x

    unsigned long temp;
    unsigned long cachedMem;
    unsigned long buffersMem;
    // Skip "total: used:..."
    char *r=fgets(buffer, static_cast<int>(sizeof(buffer)), fd);
    int status=0;
    if(r==buffer)
      {
      status+=fscanf(fd, "Mem: %lu %lu %lu %lu %lu %lu\n",
                     &tp, &temp, &ap, &temp, &buffersMem, &cachedMem);
      }
    if(status==6)
      {
      status+=fscanf(fd, "Swap: %lu %lu %lu\n", &tv, &temp, &av);
      }
    if(status==9)
      {
      this->TotalVirtualMemory = tv>>10>>10;
      this->TotalPhysicalMemory = tp>>10>>10;
      this->AvailableVirtualMemory = av>>10>>10;
      this->AvailablePhysicalMemory = (ap+buffersMem+cachedMem)>>10>>10;
      }
    else
      {
      std::cout << "Problem parsing /proc/meminfo" << std::endl;
      fclose(fd);
      return false;
      }
    }
  fclose( fd );

  return true;
#else
  return false;
#endif
}